

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall glcts::anon_unknown_0::Logger::~Logger(Logger *this)

{
  TestLog *this_00;
  char *local_38;
  long local_30;
  
  this_00 = glcts::(anonymous_namespace)::Logger::s_tcuLog;
  std::__cxx11::stringbuf::str();
  tcu::TestLog::writeMessage(this_00,local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_38);
  if (local_30 != 0) {
    tcu::TestLog::writeMessage(glcts::(anonymous_namespace)::Logger::s_tcuLog,"\n");
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->str_);
  return;
}

Assistant:

~Logger()
	{
		s_tcuLog->writeMessage(str_.str().c_str());
		if (!str_.str().empty())
		{
			s_tcuLog->writeMessage(NL);
		}
	}